

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  ulong uVar3;
  int fragNdx;
  int fragNdx_00;
  int iVar4;
  float fVar5;
  float fVar6;
  Vec4 coord;
  float local_40;
  float local_3c;
  
  if (0 < numPackets) {
    iVar4 = 0;
    uVar3 = 0;
    do {
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_40,packets + uVar3,context,0,fragNdx_00);
        fVar6 = (local_40 + local_3c) * 0.5;
        fVar5 = (local_40 - local_3c) * 0.5 + 0.5;
        pGVar1 = context->outputArray;
        iVar2 = (iVar4 + fragNdx_00) * context->numFragmentOutputs;
        pGVar1[iVar2].v.fData[0] = fVar6;
        pGVar1[iVar2].v.fData[1] = fVar5;
        *(ulong *)((long)&pGVar1[iVar2].v + 8) = CONCAT44(1.0 - fVar5,1.0 - fVar6);
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar3 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			const float			x		= coord.x();
			const float			y		= coord.y();
			const float			f0		= (x + y) * 0.5f;
			const float			f1		= 0.5f + (x - y) * 0.5f;

			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(f0, f1, 1.0f-f0, 1.0f-f1));
		}
	}